

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

void PrintDebugStream(stringstream *debugStream)

{
  long *plVar1;
  ostream *poVar2;
  allocator<char> local_99;
  string local_98 [32];
  char line [80];
  
  while( true ) {
    plVar1 = (long *)std::istream::getline((char *)debugStream,(long)line);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    poVar2 = std::operator<<((ostream *)&std::cerr,line);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)debugStream + -0x18) + (int)debugStream);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"",&local_99);
  std::__cxx11::stringbuf::str((string *)(debugStream + 0x18));
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    char line[80];
    while (debugStream.getline(line, sizeof(line)))
        std::cerr << line << std::endl;
    debugStream.clear();
    debugStream.str("");
}